

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

handle pybind11::detail::
       string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       ::cast(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *src,
             return_value_policy param_2,handle param_3)

{
  handle hVar1;
  error_already_set *this;
  
  hVar1.m_ptr = (PyObject *)PyUnicode_DecodeUTF8((src->_M_dataplus)._M_p,src->_M_string_length,0);
  if (hVar1.m_ptr != (PyObject *)0x0) {
    return (handle)hVar1.m_ptr;
  }
  this = (error_already_set *)__cxa_allocate_exception(0x28);
  error_already_set::error_already_set(this);
  __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

static typename std::enable_if<std::is_floating_point<U>::value, handle>::type
    cast(U src, return_value_policy /* policy */, handle /* parent */) {
        return PyFloat_FromDouble((double) src);
    }